

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

uint8_t * __thiscall StringBTree::parseData(StringBTree *this,KeyType *key,uint8_t *data)

{
  uint64_t uVar1;
  uint8_t *in_RDX;
  StringKey *in_RSI;
  char *value;
  uint32_t length;
  uint8_t *local_18;
  StringKey *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = decodeBitsAndAdvance(&local_18);
  StringKey::setLength(local_10,(uint32_t)uVar1);
  StringKey::setValue(local_10,(char *)local_18);
  return local_18 + (uVar1 & 0xffffffff);
}

Assistant:

const uint8_t* parseData(KeyType& key, const uint8_t* data) const
	{
		const auto length = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setLength(length);

		const auto value = reinterpret_cast<const char*>(data);
		key.setValue(value);

		data += length;
		
		return data;
	}